

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

void rationSplitter(QSplitter *splitter,float ratio)

{
  int iVar1;
  initializer_list<int> args;
  QArrayDataPointer<int> local_30;
  int local_18;
  int local_14;
  
  iVar1 = QSplitter::orientation();
  local_14 = (*(int *)(*(long *)(splitter + 0x20) + 0x1c + (ulong)(iVar1 != 1) * 4) -
             *(int *)(*(long *)(splitter + 0x20) + 0x14 + (ulong)(iVar1 != 1) * 4)) + 1;
  local_18 = (int)((float)local_14 * ratio);
  local_14 = local_14 - local_18;
  args._M_len = 2;
  args._M_array = &local_18;
  QList<int>::QList((QList<int> *)&local_30,args);
  QSplitter::setSizes((QList *)splitter);
  QArrayDataPointer<int>::~QArrayDataPointer(&local_30);
  return;
}

Assistant:

void rationSplitter(QSplitter &splitter, float ratio) {
    auto total = splitter.orientation() == Qt::Horizontal ? splitter.width() : splitter.height();
    auto first = (int)(total * ratio);
    auto second = total - first;
    splitter.setSizes({ first, second });
}